

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe.cpp
# Opt level: O3

void fe_cmov(i32 *f,i32 *g,uint b)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar9 = -b;
  uVar6 = g[1];
  uVar7 = g[2];
  uVar8 = g[3];
  uVar2 = g[4];
  uVar3 = g[5];
  uVar4 = g[6];
  uVar5 = g[7];
  uVar1 = *(ulong *)(g + 8);
  *f = *g & uVar9 | ~uVar9 & *f;
  f[1] = uVar6 & uVar9 | ~uVar9 & f[1];
  f[2] = uVar7 & uVar9 | ~uVar9 & f[2];
  f[3] = uVar8 & uVar9 | ~uVar9 & f[3];
  f[4] = ~uVar9 & f[4] | uVar2 & uVar9;
  f[5] = ~uVar9 & f[5] | uVar3 & uVar9;
  f[6] = ~uVar9 & f[6] | uVar4 & uVar9;
  f[7] = ~uVar9 & f[7] | uVar5 & uVar9;
  *(ulong *)(f + 8) = ~CONCAT44(uVar9,uVar9) & *(ulong *)(f + 8) | uVar1 & CONCAT44(uVar9,uVar9);
  return;
}

Assistant:

void fe_cmov(fe f, const fe g, unsigned int b) {
    i32 f0 = f[0];
    i32 f1 = f[1];
    i32 f2 = f[2];
    i32 f3 = f[3];
    i32 f4 = f[4];
    i32 f5 = f[5];
    i32 f6 = f[6];
    i32 f7 = f[7];
    i32 f8 = f[8];
    i32 f9 = f[9];
    i32 g0 = g[0];
    i32 g1 = g[1];
    i32 g2 = g[2];
    i32 g3 = g[3];
    i32 g4 = g[4];
    i32 g5 = g[5];
    i32 g6 = g[6];
    i32 g7 = g[7];
    i32 g8 = g[8];
    i32 g9 = g[9];
    i32 x0 = f0 ^ g0;
    i32 x1 = f1 ^ g1;
    i32 x2 = f2 ^ g2;
    i32 x3 = f3 ^ g3;
    i32 x4 = f4 ^ g4;
    i32 x5 = f5 ^ g5;
    i32 x6 = f6 ^ g6;
    i32 x7 = f7 ^ g7;
    i32 x8 = f8 ^ g8;
    i32 x9 = f9 ^ g9;

    b = (unsigned int) (- (int) b); /* silence warning */
    x0 &= b;
    x1 &= b;
    x2 &= b;
    x3 &= b;
    x4 &= b;
    x5 &= b;
    x6 &= b;
    x7 &= b;
    x8 &= b;
    x9 &= b;
    
    f[0] = f0 ^ x0;
    f[1] = f1 ^ x1;
    f[2] = f2 ^ x2;
    f[3] = f3 ^ x3;
    f[4] = f4 ^ x4;
    f[5] = f5 ^ x5;
    f[6] = f6 ^ x6;
    f[7] = f7 ^ x7;
    f[8] = f8 ^ x8;
    f[9] = f9 ^ x9;
}